

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

vector<DataElement,_std::allocator<DataElement>_> * __thiscall
Client::ReceiveDataVector
          (vector<DataElement,_std::allocator<DataElement>_> *__return_storage_ptr__,Client *this)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_38;
  int size;
  
  uStack_38 = in_RAX;
  sVar1 = recv(this->sockfd,(void *)((long)&uStack_38 + 4),4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR in Client reading from socket!");
  }
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (__return_storage_ptr__,(long)uStack_38._4_4_,(allocator_type *)((long)&uStack_38 + 3));
  if (0 < uStack_38._4_4_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      sVar1 = recv(this->sockfd,
                   (void *)((long)((__return_storage_ptr__->
                                   super__Vector_base<DataElement,_std::allocator<DataElement>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->val + lVar2),0x10,0);
      this->n = (int)sVar1;
      if ((int)sVar1 < 0) {
        puts("ERROR in Client reading from socket!");
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < uStack_38._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<DataElement> Client::ReceiveDataVector()
{
    int size;
    n = recv(sockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Client reading from socket!\n");
 
    std::vector<DataElement> V(size);
    for (int i = 0; i < size; i++)
    {
        n = recv(sockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Client reading from socket!\n");
    }
    return V;
}